

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O0

int ovf_read_segment_header(ovf_file *ovf_file_ptr,int index,ovf_segment *segment)

{
  char **in_RCX;
  char **in_R9;
  undefined1 local_b8 [4];
  int retcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ovf_segment *local_28;
  ovf_segment *segment_local;
  ovf_file *poStack_18;
  int index_local;
  ovf_file *ovf_file_ptr_local;
  
  if (ovf_file_ptr == (ovf_file *)0x0) {
    ovf_file_ptr_local._4_4_ = -2;
  }
  else {
    local_28 = segment;
    segment_local._4_4_ = index;
    poStack_18 = ovf_file_ptr;
    if (segment == (ovf_segment *)0x0) {
      std::__cxx11::string::operator=
                ((string *)&ovf_file_ptr->_state->message_latest,
                 "libovf ovf_read_segment_header: invalid segment pointer");
      ovf_file_ptr_local._4_4_ = -2;
    }
    else if ((ovf_file_ptr->found & 1U) == 0) {
      fmt::v5::format<char[60],char_const*>
                (&local_58,(v5 *)"libovf ovf_read_segment_header: file \'{}\' does not exist...",
                 (char (*) [60])ovf_file_ptr,in_RCX);
      std::__cxx11::string::operator=
                ((string *)&poStack_18->_state->message_latest,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      ovf_file_ptr_local._4_4_ = -2;
    }
    else if ((ovf_file_ptr->is_ovf & 1U) == 0) {
      fmt::v5::format<char[56],char_const*>
                (&local_78,(v5 *)"libovf ovf_read_segment_header: file \'{}\' is not ovf...",
                 (char (*) [56])ovf_file_ptr,in_RCX);
      std::__cxx11::string::operator=
                ((string *)&poStack_18->_state->message_latest,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      ovf_file_ptr_local._4_4_ = -2;
    }
    else if (index < 0) {
      fmt::v5::format<char[58],int,int,char_const*>
                (&local_98,(v5 *)"libovf ovf_read_segment_header: invalid index ({}) < 0...",
                 (char (*) [58])((long)&segment_local + 4),&ovf_file_ptr->n_segments,
                 (int *)ovf_file_ptr,in_R9);
      std::__cxx11::string::operator=
                ((string *)&poStack_18->_state->message_latest,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      ovf_file_ptr_local._4_4_ = -2;
    }
    else if (index < ovf_file_ptr->n_segments) {
      ovf_file_ptr_local._4_4_ = ovf::detail::parse::segment_header(ovf_file_ptr,index,segment);
      if (ovf_file_ptr_local._4_4_ != -1) {
        std::__cxx11::string::operator+=
                  ((string *)&poStack_18->_state->message_latest,"\novf_read_segment_header failed."
                  );
      }
    }
    else {
      fmt::v5::format<char[78],int,int,char_const*>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (v5 *)
                 "libovf ovf_read_segment_header: index ({}) >= n_segments ({}) of file \'{}\'...",
                 (char (*) [78])((long)&segment_local + 4),&ovf_file_ptr->n_segments,
                 (int *)ovf_file_ptr,in_R9);
      std::__cxx11::string::operator=
                ((string *)&poStack_18->_state->message_latest,(string *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
      ovf_file_ptr_local._4_4_ = -2;
    }
  }
  return ovf_file_ptr_local._4_4_;
}

Assistant:

int ovf_read_segment_header(struct ovf_file * ovf_file_ptr, int index, struct ovf_segment *segment)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;

    if( !segment )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_read_segment_header: invalid segment pointer";
        return OVF_ERROR;
    }

    if( !ovf_file_ptr->found )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: file \'{}\' does not exist...",
            ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( !ovf_file_ptr->is_ovf )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: file \'{}\' is not ovf...",
            ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( index < 0 )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: invalid index ({}) < 0...",
            index, ovf_file_ptr->n_segments, ovf_file_ptr->file_name);
        return OVF_ERROR;
    }

    if( index >= ovf_file_ptr->n_segments )
    {
        ovf_file_ptr->_state->message_latest = fmt::format(
            "libovf ovf_read_segment_header: index ({}) >= n_segments ({}) of file \'{}\'...",
            index, ovf_file_ptr->n_segments, ovf_file_ptr->file_name);
        return OVF_ERROR;
    }
    int retcode = ovf::detail::parse::segment_header( *ovf_file_ptr, index, *segment );
    if (retcode != OVF_OK)
        ovf_file_ptr->_state->message_latest += "\novf_read_segment_header failed.";
    return retcode;
}
catch( ... )
{
    return OVF_ERROR;
}